

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O3

int fe_process_utt(fe_t *fe,int16 *spch,size_t nsamps,mfcc_t ***cep_block,int32 *nframes)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  mfcc_t **buf_cep;
  size_t d1;
  size_t local_30;
  int16 *local_28;
  
  uVar3 = (long)fe->num_overflow_samps + nsamps;
  if (uVar3 < (ulong)(long)fe->frame_size) {
    *nframes = 0;
  }
  else {
    iVar2 = (int)((uVar3 - (long)fe->frame_size) / (ulong)(long)fe->frame_shift) + 1;
    *nframes = iVar2;
    if (iVar2 != 0) {
      d1 = (size_t)iVar2;
      bVar1 = fe->feature_dimension;
      iVar2 = 0x206;
      goto LAB_00125ef9;
    }
  }
  bVar1 = fe->feature_dimension;
  d1 = 1;
  iVar2 = 0x208;
LAB_00125ef9:
  local_30 = nsamps;
  local_28 = spch;
  buf_cep = (mfcc_t **)
            __ckd_calloc_2d__(d1,(ulong)bVar1,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                              ,iVar2);
  iVar2 = fe_process_frames_int16(fe,&local_28,&local_30,buf_cep,nframes);
  *cep_block = buf_cep;
  return iVar2;
}

Assistant:

int
fe_process_utt(fe_t * fe, int16 const * spch, size_t nsamps,
               mfcc_t *** cep_block, int32 * nframes)
{
    mfcc_t **cep;
    int rv;

    /* Figure out how many frames we will need. */
    fe_process_frames_int16(fe, NULL, &nsamps, NULL, nframes);
    /* Create the output buffer (it has to exist, even if there are no output frames). */
    if (*nframes)
        cep = (mfcc_t **)ckd_calloc_2d(*nframes, fe->feature_dimension, sizeof(**cep));
    else
        cep = (mfcc_t **)ckd_calloc_2d(1, fe->feature_dimension, sizeof(**cep));
    /* Now just call fe_process_frames() with the allocated buffer. */
    rv = fe_process_frames_int16(fe, &spch, &nsamps, cep, nframes);
    *cep_block = cep;

    return rv;
}